

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O2

Vec_Bit_t * Ree_CollectInsiders(Gia_Man_t *pGia,Vec_Int_t *vAdds)

{
  int iVar1;
  int iVar2;
  int i;
  Vec_Bit_t *p;
  Vec_Bit_t *vInsiders;
  int Entry;
  int Entry_00;
  int Entry_01;
  int i_00;
  
  p = Vec_BitStart(pGia->nObjs);
  vInsiders = Vec_BitStart(pGia->nObjs);
  for (i_00 = 0; i_00 < vAdds->nSize; i_00 = i_00 + 6) {
    iVar1 = Vec_IntEntry(vAdds,i_00 + 2);
    if (iVar1 != 0) {
      iVar1 = Vec_IntEntry(vAdds,i_00);
      iVar2 = Vec_IntEntry(vAdds,i_00 + 1);
      i = Vec_IntEntry(vAdds,i_00 + 2);
      Vec_BitWriteEntry(p,iVar1,Entry);
      Vec_BitWriteEntry(p,iVar2,Entry_00);
      Vec_BitWriteEntry(p,i,Entry_01);
      iVar1 = Vec_IntEntry(vAdds,i_00 + 3);
      iVar2 = Vec_IntEntry(vAdds,i_00 + 4);
      Ree_CollectInsiders_rec(pGia,iVar1,p,vInsiders);
      Ree_CollectInsiders_rec(pGia,iVar2,p,vInsiders);
    }
  }
  Vec_BitFree(p);
  return vInsiders;
}

Assistant:

Vec_Bit_t * Ree_CollectInsiders( Gia_Man_t * pGia, Vec_Int_t * vAdds )
{
    Vec_Bit_t * vVisited = Vec_BitStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vInsiders = Vec_BitStart( Gia_ManObjNum(pGia) );
    int i, Entry1, Entry2, Entry3;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
    {
        if ( Vec_IntEntry(vAdds, 6*i+2) == 0 ) // HADD
            continue;
        // mark inputs
        Entry1 = Vec_IntEntry( vAdds, 6*i + 0 );
        Entry2 = Vec_IntEntry( vAdds, 6*i + 1 );
        Entry3 = Vec_IntEntry( vAdds, 6*i + 2 );
        Vec_BitWriteEntry( vVisited, Entry1, 1 );
        Vec_BitWriteEntry( vVisited, Entry2, 1 );
        Vec_BitWriteEntry( vVisited, Entry3, 1 );
        // traverse from outputs
        Entry1 = Vec_IntEntry( vAdds, 6*i + 3 );
        Entry2 = Vec_IntEntry( vAdds, 6*i + 4 );
        Ree_CollectInsiders_rec( pGia, Entry1, vVisited, vInsiders );
        Ree_CollectInsiders_rec( pGia, Entry2, vVisited, vInsiders );
    }
    Vec_BitFree( vVisited );
    return vInsiders;
}